

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_10::TsCodeGenerator::GenerateMakeRule
          (TsCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  _Base_ptr p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  string make_rule;
  string filebase;
  TsGenerator generator;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  TsGenerator local_268;
  
  StripExtension((string *)&local_268,filename);
  StripPath(&local_2a8,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  ts::TsGenerator::TsGenerator(&local_268,parser,path,filename);
  BaseGenerator::GeneratedFileName
            ((string *)&_Stack_2f8,&local_268.super_BaseGenerator,path,&local_2a8,&parser->opts);
  std::operator+(&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_2f8,
                 ": ");
  std::__cxx11::string::~string((string *)&_Stack_2f8);
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&_Stack_2f8,parser,filename);
  for (p_Var1 = _Stack_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &_Stack_2f8._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_288," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::__cxx11::string::append((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_288);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_2f8);
  ts::TsGenerator::~TsGenerator(&local_268);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::operator=((string *)output,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = TSMakeRule(parser, path, filename);
    return Status::OK;
  }